

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall re2::Prog::DumpUnanchored_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  int i;
  bool bVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  Workq q;
  
  if (this->did_flatten_ == true) {
    FlattenedProgToString_abi_cxx11_
              (__return_storage_ptr__,(re2 *)this,(Prog *)(ulong)(uint)this->start_unanchored_,
               in_ECX);
  }
  else {
    SparseSet::SparseSet((SparseSet *)&stack0xffffffffffffffd0,this->size_);
    i = this->start_unanchored_;
    if (i != 0) {
      bVar1 = SparseSet::contains((SparseSet *)&stack0xffffffffffffffd0,i);
      if (!bVar1) {
        SparseSet::insert_new((SparseSet *)&stack0xffffffffffffffd0,i);
      }
    }
    ProgToString_abi_cxx11_
              (__return_storage_ptr__,(re2 *)this,(Prog *)&stack0xffffffffffffffd0,
               (Workq *)CONCAT44(in_register_0000000c,in_ECX));
    SparseSet::~SparseSet((SparseSet *)&stack0xffffffffffffffd0);
  }
  return __return_storage_ptr__;
}

Assistant:

string Prog::DumpUnanchored() {
  if (did_flatten_)
    return FlattenedProgToString(this, start_unanchored_);

  Workq q(size_);
  AddToQueue(&q, start_unanchored_);
  return ProgToString(this, &q);
}